

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O1

void __thiscall cfd::core::AdaptorProof::AdaptorProof(AdaptorProof *this,ByteData *data)

{
  size_t sVar1;
  CfdException *this_00;
  string local_48;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&data->data_);
  sVar1 = ByteData::GetDataSize(&this->data_);
  if (sVar1 == 0x61) {
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Invalid adaptor proof data.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_48);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

AdaptorProof::AdaptorProof(const ByteData &data) : data_(data) {
  if ((data_.GetDataSize()) != AdaptorProof::kAdaptorProofSize) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid adaptor proof data.");
  }
}